

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O3

void xercesc_4_0::XMLString::sizeToText
               (XMLSize_t toFormat,char *toFill,XMLSize_t maxChars,uint radix,MemoryManager *manager
               )

{
  byte *pbVar1;
  RuntimeException *this;
  ulong uVar2;
  pointer_____offset_0x10___ *ppuVar3;
  ulong uVar4;
  bool bVar5;
  char tmpBuf [128];
  undefined8 uStack_a0;
  byte local_98 [136];
  
  if (maxChars == 0) {
    uStack_a0 = 0x24f086;
    this = (RuntimeException *)__cxa_allocate_exception(0x30);
    uStack_a0 = 0x24f0a5;
    IllegalArgumentException::IllegalArgumentException
              ((IllegalArgumentException *)this,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLString.cpp"
               ,0x61,Str_ZeroSizedTargetBuf,manager);
  }
  else {
    if (toFormat == 0) {
      toFill[0] = '0';
      toFill[1] = '\0';
      return;
    }
    if (radix == 2) {
      uVar2 = 0;
      do {
        local_98[uVar2] = (byte)toFormat & 1 | 0x30;
        uVar2 = uVar2 + 1;
        bVar5 = 1 < toFormat;
        toFormat = toFormat >> 1;
      } while (bVar5);
    }
    else if (radix == 0x10) {
      uVar2 = 0;
      do {
        local_98[uVar2] = "0123456789ABCDEF"[(uint)toFormat & 0xf];
        uVar2 = uVar2 + 1;
        bVar5 = 0xf < toFormat;
        toFormat = toFormat >> 4;
      } while (bVar5);
    }
    else {
      if ((radix & 0xfffffffd) != 8) {
        uStack_a0 = 0x24f0f0;
        this = (RuntimeException *)__cxa_allocate_exception(0x30);
        uStack_a0 = 0x24f10f;
        RuntimeException::RuntimeException
                  (this,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLString.cpp"
                   ,0x9c,Str_UnknownRadix,manager);
        ppuVar3 = &RuntimeException::typeinfo;
        goto LAB_0024f0d7;
      }
      uVar4 = (ulong)radix;
      uVar2 = 0;
      do {
        local_98[uVar2] = "0123456789ABCDEF"[toFormat % uVar4];
        uVar2 = uVar2 + 1;
        bVar5 = uVar4 <= toFormat;
        toFormat = toFormat / uVar4;
      } while (bVar5);
    }
    pbVar1 = (byte *)toFill;
    uVar4 = uVar2;
    if (uVar2 <= maxChars) {
      for (; uVar4 != 0; uVar4 = uVar4 - 1) {
        *pbVar1 = local_98[uVar4 - 1];
        pbVar1 = pbVar1 + 1;
      }
      toFill[uVar2] = '\0';
      return;
    }
    uStack_a0 = 0x24f0b1;
    this = (RuntimeException *)__cxa_allocate_exception(0x30);
    uStack_a0 = 0x24f0d0;
    IllegalArgumentException::IllegalArgumentException
              ((IllegalArgumentException *)this,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLString.cpp"
               ,0xa2,Str_TargetBufTooSmall,manager);
  }
  ppuVar3 = &IllegalArgumentException::typeinfo;
LAB_0024f0d7:
  uStack_a0 = 0x24f0e6;
  __cxa_throw(this,ppuVar3,XMLException::~XMLException);
}

Assistant:

void XMLString::sizeToText(  const  XMLSize_t           toFormat
                            ,       char* const          toFill
                            , const XMLSize_t            maxChars
                            , const unsigned int         radix
                            , MemoryManager* const       manager)
{
    static const char digitList[16] =
    {
          '0', '1', '2', '3', '4', '5', '6', '7', '8', '9'
        , 'A', 'B', 'C', 'D', 'E', 'F'
    };

    if (!maxChars)
        ThrowXMLwithMemMgr(IllegalArgumentException, XMLExcepts::Str_ZeroSizedTargetBuf, manager);

    // Handle special case
    if (!toFormat)
    {
        toFill[0] = '0';
        toFill[1] = 0;
        return;
    }

    // This is used to fill the temp buffer
    XMLSize_t tmpIndex = 0;

    // A copy of the conversion value that we can modify
    XMLSize_t tmpVal = toFormat;

    //
    //  Convert into a temp buffer that we know is large enough. This avoids
    //  having to check for overflow in the inner loops, and we have to flip
    //  the resulting XMLString anyway.
    //
    char   tmpBuf[128];

    //
    //  For each radix, do the optimal thing. For bin and hex, we can special
    //  case them and do shift and mask oriented stuff. For oct and decimal
    //  there isn't much to do but bull through it with divides.
    //
    if (radix == 2)
    {
        while (tmpVal)
        {
            if (tmpVal & 0x1UL)
                tmpBuf[tmpIndex++] = '1';
            else
                tmpBuf[tmpIndex++] = '0';
            tmpVal >>= 1;
        }
    }
     else if (radix == 16)
    {
        while (tmpVal)
        {
            const XMLSize_t charInd = (tmpVal & 0xFUL);
            tmpBuf[tmpIndex++] = digitList[charInd];
            tmpVal >>= 4;
        }
    }
     else if ((radix == 8) || (radix == 10))
    {
        while (tmpVal)
        {
            const XMLSize_t charInd = (tmpVal % radix);
            tmpBuf[tmpIndex++] = digitList[charInd];
            tmpVal /= radix;
        }
    }
    else
    {
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Str_UnknownRadix, manager);
    }

    // See if have enough room in the caller's buffer
    if (tmpIndex > maxChars)
    {
        ThrowXMLwithMemMgr(IllegalArgumentException, XMLExcepts::Str_TargetBufTooSmall, manager);
    }

    // Reverse the tmp buffer into the caller's buffer
    XMLSize_t outIndex = 0;
    for (; tmpIndex > 0; tmpIndex--)
        toFill[outIndex++] = tmpBuf[tmpIndex-1];

    // And cap off the caller's buffer
    toFill[outIndex] = char(0);
}